

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

bool CheckValidFacesIndices(aiFace *faces,uint nFaces,uint nVerts)

{
  uint local_28;
  uint idx;
  uint j;
  uint i;
  uint nVerts_local;
  uint nFaces_local;
  aiFace *faces_local;
  
  idx = 0;
  do {
    if (nFaces <= idx) {
      return true;
    }
    for (local_28 = 0; local_28 < faces[idx].mNumIndices; local_28 = local_28 + 1) {
      if (nVerts <= faces[idx].mIndices[local_28]) {
        return false;
      }
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static inline bool CheckValidFacesIndices(aiFace *faces, unsigned nFaces, unsigned nVerts) {
	for (unsigned i = 0; i < nFaces; ++i) {
		for (unsigned j = 0; j < faces[i].mNumIndices; ++j) {
			unsigned idx = faces[i].mIndices[j];
			if (idx >= nVerts)
				return false;
		}
	}
	return true;
}